

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2)

{
  Token star;
  Token dot;
  WildcardPortConnectionSyntax *attributes;
  Info *in_RCX;
  undefined8 *in_RDX;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  attributes = (WildcardPortConnectionSyntax *)
               allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8);
  dot.info = in_RCX;
  dot._0_8_ = in_RDX[1];
  star.info = (Info *)*in_RDX;
  star._0_8_ = in_RCX->location;
  slang::syntax::WildcardPortConnectionSyntax::WildcardPortConnectionSyntax
            ((WildcardPortConnectionSyntax *)in_RCX->rawTextPtr,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes,dot,star);
  return attributes;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }